

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance1.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  undefined8 local_14;
  undefined4 local_c;
  
  print_compiler();
  local_14 = 0x300000002;
  local_c = 4;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_14;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"v[1] = ",7);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  local_14 = CONCAT71(local_14._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_14,1);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

extern template class std::vector<int>;

int main (int argc, char* argv[]) 
{
    print_compiler();

    std::vector<int> v= {2, 3, 4};
    std::cout << "v[1] = " << v[1] << '\n';

    return 0;
}